

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cluster_linearize.h
# Opt level: O0

void (anonymous_namespace)::DepGraphFormatter::
     Ser<VectorWriter,bitset_detail::IntBitSet<unsigned_int>>
               (VectorWriter *s,DepGraph<bitset_detail::IntBitSet<unsigned_int>_> *depgraph)

{
  value_type vVar1;
  long lVar2;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  __last;
  bool bVar3;
  size_type sVar4;
  reference pvVar5;
  ulong uVar6;
  reference puVar7;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  long in_FS_OFFSET;
  ClusterIndex insert_distance;
  ClusterIndex dep_idx;
  ClusterIndex dep_dist;
  ClusterIndex topo_idx;
  uint64_t diff;
  IntBitSet<unsigned_int> written_parents;
  ClusterIndex idx;
  vector<unsigned_int,_std::allocator<unsigned_int>_> rebuilt_order;
  vector<unsigned_int,_std::allocator<unsigned_int>_> topo_order;
  undefined4 in_stack_fffffffffffffe48;
  uint in_stack_fffffffffffffe4c;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  in_stack_fffffffffffffe50;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  in_stack_fffffffffffffe58;
  anon_class_8_1_1fb6941d in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe74;
  value_type vVar8;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  in_stack_fffffffffffffe78;
  size_type in_stack_fffffffffffffe80;
  Wrapper<VarIntFormatter<(VarIntMode)0>,_unsigned_long_&> in_stack_fffffffffffffe88;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this;
  iterator in_stack_fffffffffffffee0;
  uint local_118;
  uint local_110;
  uint local_10c;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::TxCount
            ((DepGraph<bitset_detail::IntBitSet<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
  std::allocator<unsigned_int>::allocator
            ((allocator<unsigned_int> *)
             CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             in_stack_fffffffffffffe78._M_current,
             CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
             (allocator_type *)in_stack_fffffffffffffe68.depgraph);
  std::allocator<unsigned_int>::~allocator
            ((allocator<unsigned_int> *)
             CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             in_stack_fffffffffffffe50._M_current);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             in_stack_fffffffffffffe50._M_current);
  std::
  iota<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,unsigned_int>
            (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             in_stack_fffffffffffffe50._M_current);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             in_stack_fffffffffffffe50._M_current);
  __last._M_current._4_4_ = in_stack_fffffffffffffe74;
  __last._M_current._0_4_ = in_stack_fffffffffffffe70;
  std::
  sort<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,(anonymous_namespace)::DepGraphFormatter::Ser<VectorWriter,bitset_detail::IntBitSet<unsigned_int>>(VectorWriter&,cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>>const&)::_lambda(unsigned_int,unsigned_int)_1_>
            (in_stack_fffffffffffffe78,__last,in_stack_fffffffffffffe68);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
  cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::TxCount
            ((DepGraph<bitset_detail::IntBitSet<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             in_stack_fffffffffffffe88.m_object,in_stack_fffffffffffffe80);
  local_10c = 0;
  do {
    sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    if (sVar4 <= local_10c) {
      VectorWriter::operator<<
                ((VectorWriter *)in_stack_fffffffffffffe58._M_current,
                 (uchar *)in_stack_fffffffffffffe50._M_current);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 in_stack_fffffffffffffe58._M_current);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 in_stack_fffffffffffffe58._M_current);
      if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
        __stack_chk_fail();
      }
      return;
    }
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        in_stack_fffffffffffffe58._M_current,
                        (size_type)in_stack_fffffffffffffe50._M_current);
    vVar1 = *pvVar5;
    cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::FeeRate
              ((DepGraph<bitset_detail::IntBitSet<unsigned_int>_> *)
               in_stack_fffffffffffffe58._M_current,
               (ClusterIndex)((ulong)in_stack_fffffffffffffe50._M_current >> 0x20));
    Using<VarIntFormatter<(VarIntMode)1>,int_const&>((int *)in_stack_fffffffffffffe50._M_current);
    VectorWriter::operator<<
              ((VectorWriter *)in_stack_fffffffffffffe58._M_current,
               (Wrapper<VarIntFormatter<(VarIntMode)1>,_const_int_&> *)
               in_stack_fffffffffffffe50._M_current);
    this = in_RDI;
    cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::FeeRate
              ((DepGraph<bitset_detail::IntBitSet<unsigned_int>_> *)
               in_stack_fffffffffffffe58._M_current,
               (ClusterIndex)((ulong)in_stack_fffffffffffffe50._M_current >> 0x20));
    anon_unknown.dwarf_313425::DepGraphFormatter::SignedToUnsigned
              ((int64_t)in_stack_fffffffffffffe50._M_current);
    Using<VarIntFormatter<(VarIntMode)0>,unsigned_long>
              ((unsigned_long *)in_stack_fffffffffffffe50._M_current);
    VectorWriter::operator<<
              ((VectorWriter *)in_stack_fffffffffffffe58._M_current,
               (Wrapper<VarIntFormatter<(VarIntMode)0>,_unsigned_long_&> *)
               in_stack_fffffffffffffe50._M_current);
    bitset_detail::IntBitSet<unsigned_int>::IntBitSet
              ((IntBitSet<unsigned_int> *)
               CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    for (local_110 = 0; local_110 < local_10c; local_110 = local_110 + 1) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 in_stack_fffffffffffffe58._M_current,
                 (size_type)in_stack_fffffffffffffe50._M_current);
      cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Descendants
                ((DepGraph<bitset_detail::IntBitSet<unsigned_int>_> *)
                 in_stack_fffffffffffffe58._M_current,
                 (ClusterIndex)((ulong)in_stack_fffffffffffffe50._M_current >> 0x20));
      bVar3 = bitset_detail::IntBitSet<unsigned_int>::Overlaps
                        ((IntBitSet<unsigned_int> *)in_stack_fffffffffffffe58._M_current,
                         (IntBitSet<unsigned_int> *)in_stack_fffffffffffffe50._M_current);
      if (!bVar3) {
        cluster_linearize::DepGraph<bitset_detail::IntBitSet<unsigned_int>_>::Ancestors
                  ((DepGraph<bitset_detail::IntBitSet<unsigned_int>_> *)
                   in_stack_fffffffffffffe58._M_current,
                   (ClusterIndex)((ulong)in_stack_fffffffffffffe50._M_current >> 0x20));
        bVar3 = bitset_detail::IntBitSet<unsigned_int>::operator[]
                          ((IntBitSet<unsigned_int> *)in_stack_fffffffffffffe50._M_current,
                           in_stack_fffffffffffffe4c);
        if (bVar3) {
          in_stack_fffffffffffffe88 =
               Using<VarIntFormatter<(VarIntMode)0>,unsigned_long&>
                         ((unsigned_long *)in_stack_fffffffffffffe50._M_current);
          VectorWriter::operator<<
                    ((VectorWriter *)in_stack_fffffffffffffe58._M_current,
                     (Wrapper<VarIntFormatter<(VarIntMode)0>,_unsigned_long_&> *)
                     in_stack_fffffffffffffe50._M_current);
          bitset_detail::IntBitSet<unsigned_int>::Set
                    ((IntBitSet<unsigned_int> *)in_stack_fffffffffffffe50._M_current,
                     in_stack_fffffffffffffe4c);
        }
      }
    }
    local_118 = 0;
    while( true ) {
      uVar6 = (ulong)local_118;
      sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
      if (sVar4 <= uVar6) break;
      vVar8 = vVar1;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 in_stack_fffffffffffffe50._M_current);
      __gnu_cxx::
      __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
      operator-((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 *)in_stack_fffffffffffffe58._M_current,
                (difference_type)in_stack_fffffffffffffe50._M_current);
      __gnu_cxx::
      __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
      operator-((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 *)in_stack_fffffffffffffe58._M_current,
                (difference_type)in_stack_fffffffffffffe50._M_current);
      puVar7 = __gnu_cxx::
               __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator*((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                            *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
      if (*puVar7 < vVar8) break;
      local_118 = local_118 + 1;
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               in_stack_fffffffffffffe50._M_current);
    __gnu_cxx::
    __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
    operator-((__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               *)in_stack_fffffffffffffe58._M_current,
              (difference_type)in_stack_fffffffffffffe50._M_current);
    __gnu_cxx::
    __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>::
    __normal_iterator<unsigned_int*>
              ((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                *)in_stack_fffffffffffffe58._M_current,
               (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                *)in_stack_fffffffffffffe50._M_current);
    in_stack_fffffffffffffee0 =
         std::vector<unsigned_int,_std::allocator<unsigned_int>_>::insert
                   (this,in_stack_fffffffffffffee0._M_current,
                    (value_type_conflict5 *)in_stack_fffffffffffffe88.m_object);
    in_stack_fffffffffffffe50._M_current = (uint *)in_RDI;
    in_stack_fffffffffffffe58._M_current =
         (uint *)Using<VarIntFormatter<(VarIntMode)0>,unsigned_long>((unsigned_long *)in_RDI);
    VectorWriter::operator<<
              ((VectorWriter *)in_stack_fffffffffffffe58._M_current,
               (Wrapper<VarIntFormatter<(VarIntMode)0>,_unsigned_long_&> *)
               in_stack_fffffffffffffe50._M_current);
    local_10c = local_10c + 1;
  } while( true );
}

Assistant:

static void Ser(Stream& s, const DepGraph<SetType>& depgraph)
    {
        /** Construct a topological order to serialize the transactions in. */
        std::vector<ClusterIndex> topo_order(depgraph.TxCount());
        std::iota(topo_order.begin(), topo_order.end(), ClusterIndex{0});
        std::sort(topo_order.begin(), topo_order.end(), [&](ClusterIndex a, ClusterIndex b) {
            auto anc_a = depgraph.Ancestors(a).Count(), anc_b = depgraph.Ancestors(b).Count();
            if (anc_a != anc_b) return anc_a < anc_b;
            return a < b;
        });

        /** Which transactions the deserializer already knows when it has deserialized what has
         *  been serialized here so far, and in what order. */
        std::vector<ClusterIndex> rebuilt_order;
        rebuilt_order.reserve(depgraph.TxCount());

        // Loop over the transactions in topological order.
        for (ClusterIndex topo_idx = 0; topo_idx < topo_order.size(); ++topo_idx) {
            /** Which depgraph index we are currently writing. */
            ClusterIndex idx = topo_order[topo_idx];
            // Write size, which must be larger than 0.
            s << VARINT_MODE(depgraph.FeeRate(idx).size, VarIntMode::NONNEGATIVE_SIGNED);
            // Write fee, encoded as an unsigned varint (odd=negative, even=non-negative).
            s << VARINT(SignedToUnsigned(depgraph.FeeRate(idx).fee));
            // Write dependency information.
            SetType written_parents;
            uint64_t diff = 0; //!< How many potential parent/child relations we have skipped over.
            for (ClusterIndex dep_dist = 0; dep_dist < topo_idx; ++dep_dist) {
                /** Which depgraph index we are currently considering as parent of idx. */
                ClusterIndex dep_idx = topo_order[topo_idx - 1 - dep_dist];
                // Ignore transactions which are already known to be ancestors.
                if (depgraph.Descendants(dep_idx).Overlaps(written_parents)) continue;
                if (depgraph.Ancestors(idx)[dep_idx]) {
                    // When an actual parent is encountered, encode how many non-parents were skipped
                    // before it.
                    s << VARINT(diff);
                    diff = 0;
                    written_parents.Set(dep_idx);
                } else {
                    // When a non-parent is encountered, increment the skip counter.
                    ++diff;
                }
            }
            // Write position information.
            ClusterIndex insert_distance = 0;
            while (insert_distance < rebuilt_order.size()) {
                // Loop to find how far from the end in rebuilt_order to insert.
                if (idx > *(rebuilt_order.end() - 1 - insert_distance)) break;
                ++insert_distance;
            }
            rebuilt_order.insert(rebuilt_order.end() - insert_distance, idx);
            s << VARINT(diff + insert_distance);
        }

        // Output a final 0 to denote the end of the graph.
        s << uint8_t{0};
    }